

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptUnaryExpression(HlslGrammar *this,TIntermTyped **node)

{
  bool bVar1;
  EHlslTokenClass op;
  TIntermTyped *pTVar2;
  undefined1 local_110 [8];
  TSourceLoc loc;
  TIntermTyped *pTStack_f0;
  TOperator unaryOp;
  TIntermTyped *arguments;
  TFunction *constructorFunction;
  undefined1 local_d8 [8];
  TSourceLoc loc_1;
  TArraySizes *arraySizes;
  TType castType;
  TIntermTyped **node_local;
  HlslGrammar *this_local;
  
  castType.spirvType = (TSpirvType *)node;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
  if (bVar1) {
    TType::TType((TType *)&arraySizes,EbtVoid,EvqTemporary,1,0,0,false);
    bVar1 = acceptType(this,(TType *)&arraySizes);
    if (bVar1) {
      loc_1.column = 0;
      loc_1._20_4_ = 0;
      acceptArraySpecifier(this,(TArraySizes **)&loc_1.column);
      if (loc_1._16_8_ != 0) {
        TType::transferArraySizes((TType *)&arraySizes,(TArraySizes *)loc_1._16_8_);
      }
      local_d8 = (undefined1  [8])(this->super_HlslTokenStream).token.loc.name;
      loc_1.name = *(TString **)&(this->super_HlslTokenStream).token.loc.string;
      loc_1.string = (this->super_HlslTokenStream).token.loc.column;
      loc_1.line = *(int *)&(this->super_HlslTokenStream).token.loc.field_0x14;
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
      if (bVar1) {
        bVar1 = acceptUnaryExpression(this,(TIntermTyped **)castType.spirvType);
        if (bVar1) {
          arguments = (TIntermTyped *)
                      HlslParseContext::makeConstructorCall
                                (this->parseContext,(TSourceLoc *)local_d8,(TType *)&arraySizes);
          if ((TFunction *)arguments == (TFunction *)0x0) {
            expected(this,"type that can be constructed");
            this_local._7_1_ = 0;
            constructorFunction._4_4_ = 1;
          }
          else {
            pTStack_f0 = (TIntermTyped *)0x0;
            HlslParseContext::handleFunctionArgument
                      (this->parseContext,(TFunction *)arguments,&stack0xffffffffffffff10,
                       (TIntermTyped *)
                       ((castType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                       allocator);
            pTVar2 = HlslParseContext::handleFunctionCall
                               (this->parseContext,(TSourceLoc *)local_d8,(TFunction *)arguments,
                                pTStack_f0);
            ((castType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.allocator =
                 (TPoolAllocator *)pTVar2;
            this_local._7_1_ =
                 ((castType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.allocator !=
                 (TPoolAllocator *)0x0;
            constructorFunction._4_4_ = 1;
          }
        }
        else {
          this_local._7_1_ = 0;
          constructorFunction._4_4_ = 1;
        }
      }
      else {
        HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
        HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
        if (loc_1._16_8_ != 0) {
          (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            [0x2d])(this->parseContext,local_d8,"parenthesized array constructor not allowed",
                    "([]())","");
        }
        constructorFunction._4_4_ = 0;
      }
    }
    else {
      HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
      this_local._7_1_ = acceptPostfixExpression(this,(TIntermTyped **)castType.spirvType);
      constructorFunction._4_4_ = 1;
    }
    TType::~TType((TType *)&arraySizes);
    if (constructorFunction._4_4_ != 0) goto LAB_005acc89;
  }
  op = HlslTokenStream::peek(&this->super_HlslTokenStream);
  loc._20_4_ = HlslOpMap::preUnary(op);
  if (loc._20_4_ == EOpNull) {
    this_local._7_1_ = acceptPostfixExpression(this,(TIntermTyped **)castType.spirvType);
  }
  else {
    local_110 = (undefined1  [8])(this->super_HlslTokenStream).token.loc.name;
    loc.name = *(TString **)&(this->super_HlslTokenStream).token.loc.string;
    loc.string = (this->super_HlslTokenStream).token.loc.column;
    loc.line = *(int *)&(this->super_HlslTokenStream).token.loc.field_0x14;
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    bVar1 = acceptUnaryExpression(this,(TIntermTyped **)castType.spirvType);
    if (bVar1) {
      if (loc._20_4_ == 0x19) {
        this_local._7_1_ = 1;
      }
      else {
        pTVar2 = TIntermediate::addUnaryMath
                           (this->intermediate,loc._20_4_,
                            (TIntermTyped *)
                            ((castType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.
                            allocator,(TSourceLoc *)local_110);
        ((castType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.allocator =
             (TPoolAllocator *)pTVar2;
        if ((loc._20_4_ == 0xe) || (loc._20_4_ == 0xf)) {
          pTVar2 = HlslParseContext::handleLvalue
                             (this->parseContext,(TSourceLoc *)local_110,"unary operator",
                              (TIntermTyped **)castType.spirvType);
          ((castType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.allocator =
               (TPoolAllocator *)pTVar2;
        }
        this_local._7_1_ =
             ((castType.spirvType)->spirvInst).set._M_dataplus.super_allocator_type.allocator !=
             (TPoolAllocator *)0x0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
LAB_005acc89:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool HlslGrammar::acceptUnaryExpression(TIntermTyped*& node)
{
    // (type) unary_expression
    // Have to look two steps ahead, because this could be, e.g., a
    // postfix_expression instead, since that also starts with at "(".
    if (acceptTokenClass(EHTokLeftParen)) {
        TType castType;
        if (acceptType(castType)) {
            // recognize any array_specifier as part of the type
            TArraySizes* arraySizes = nullptr;
            acceptArraySpecifier(arraySizes);
            if (arraySizes != nullptr)
                castType.transferArraySizes(arraySizes);
            TSourceLoc loc = token.loc;
            if (acceptTokenClass(EHTokRightParen)) {
                // We've matched "(type)" now, get the expression to cast
                if (! acceptUnaryExpression(node))
                    return false;

                // Hook it up like a constructor
                TFunction* constructorFunction = parseContext.makeConstructorCall(loc, castType);
                if (constructorFunction == nullptr) {
                    expected("type that can be constructed");
                    return false;
                }
                TIntermTyped* arguments = nullptr;
                parseContext.handleFunctionArgument(constructorFunction, arguments, node);
                node = parseContext.handleFunctionCall(loc, constructorFunction, arguments);

                return node != nullptr;
            } else {
                // This could be a parenthesized constructor, ala (int(3)), and we just accepted
                // the '(int' part.  We must back up twice.
                recedeToken();
                recedeToken();

                // Note, there are no array constructors like
                //   (float[2](...))
                if (arraySizes != nullptr)
                    parseContext.error(loc, "parenthesized array constructor not allowed", "([]())", "", "");
            }
        } else {
            // This isn't a type cast, but it still started "(", so if it is a
            // unary expression, it can only be a postfix_expression, so try that.
            // Back it up first.
            recedeToken();
            return acceptPostfixExpression(node);
        }
    }

    // peek for "op unary_expression"
    TOperator unaryOp = HlslOpMap::preUnary(peek());

    // postfix_expression (if no unary operator)
    if (unaryOp == EOpNull)
        return acceptPostfixExpression(node);

    // op unary_expression
    TSourceLoc loc = token.loc;
    advanceToken();
    if (! acceptUnaryExpression(node))
        return false;

    // + is a no-op
    if (unaryOp == EOpAdd)
        return true;

    node = intermediate.addUnaryMath(unaryOp, node, loc);

    // These unary ops require lvalues
    if (unaryOp == EOpPreIncrement || unaryOp == EOpPreDecrement)
        node = parseContext.handleLvalue(loc, "unary operator", node);

    return node != nullptr;
}